

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O1

bool deqp::gls::anon_unknown_1::hasAttributeAliasing
               (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                *attributes,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *bindings)

{
  ulong uVar1;
  pointer pAVar2;
  const_iterator cVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  _Rb_tree_color _Var11;
  ulong uVar12;
  vector<bool,_std::allocator<bool>_> reservedSpaces;
  vector<bool,_std::allocator<bool>_> local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *local_70;
  ulong local_68;
  _Base_ptr local_60;
  long *local_58 [2];
  long local_48 [2];
  ulong local_38;
  
  local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pAVar2 = (attributes->
           super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar4 = (int)((ulong)((long)(attributes->
                              super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) >> 7);
  bVar8 = 0 < iVar4;
  if (0 < iVar4) {
    local_60 = &(bindings->_M_t)._M_impl.super__Rb_tree_header._M_header;
    lVar10 = 0;
    local_68 = 0x800000000000003f;
    local_70 = &bindings->_M_t;
    do {
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::find(local_70,&pAVar2[lVar10].m_name);
      if (cVar3._M_node == local_60) {
        _Var11 = ~_S_red;
      }
      else {
        _Var11 = cVar3._M_node[2]._M_color;
      }
      pAVar2 = (attributes->
               super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar6 = *(long *)&pAVar2[lVar10].m_type.m_name._M_dataplus;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,lVar6,pAVar2[lVar10].m_type.m_name._M_string_length + lVar6);
      uVar9._0_4_ = pAVar2[lVar10].m_type.m_locationSize;
      uVar9._4_4_ = pAVar2[lVar10].m_type.m_glTypeEnum;
      local_38 = uVar9;
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      uVar1 = local_68;
      if (_Var11 != ~_S_red) {
        uVar12 = uVar9 & 0xffffffff;
        if ((ulong)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
            ((long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <
            (ulong)((undefined4)uVar9 + _Var11)) {
          std::vector<bool,_std::allocator<bool>_>::resize
                    (&local_98,(ulong)((undefined4)uVar9 + _Var11),false);
        }
        if (0 < (int)(undefined4)uVar9) {
          do {
            uVar5 = (ulong)(int)_Var11;
            uVar9 = uVar5 + 0x3f;
            if (-1 < (long)uVar5) {
              uVar9 = uVar5;
            }
            uVar7 = (ulong)((uVar5 & uVar1) < 0x8000000000000001);
            if ((local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar9 >> 6) + (uVar7 - 1)] >> (uVar5 & 0x3f) & 1) != 0) goto LAB_004cdfc0;
            local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[((long)uVar9 >> 6) + (uVar7 - 1)] =
                 local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar9 >> 6) + (uVar7 - 1)] | 1L << ((byte)_Var11 & 0x3f);
            _Var11 = _Var11 + _S_black;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
        }
      }
      lVar10 = lVar10 + 1;
      pAVar2 = (attributes->
               super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar6 = (long)(int)((ulong)((long)(attributes->
                                        super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2)
                         >> 7);
      bVar8 = lVar10 < lVar6;
    } while (lVar10 < lVar6);
  }
LAB_004cdfc0:
  if (local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return bVar8;
}

Assistant:

bool hasAttributeAliasing (const vector<Attribute>& attributes, const map<string, deUint32>& bindings)
{
	vector<bool> reservedSpaces;

	for (int attribNdx = 0; attribNdx < (int)attributes.size(); attribNdx++)
	{
		const deInt32	location	= getBoundLocation(bindings, attributes[attribNdx].getName());
		const deUint32	size		= attributes[attribNdx].getType().getLocationSize();

		if (location != Attribute::LOC_UNDEF)
		{
			if (reservedSpaces.size() < location + size)
				reservedSpaces.resize(location + size, false);

			for (int i = 0; i < (int)size; i++)
			{
				if (reservedSpaces[location + i])
					return true;

				reservedSpaces[location + i] = true;
			}
		}
	}

	return false;
}